

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

char * mg_md5(char *buf,...)

{
  uchar *buf_00;
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_170;
  undefined8 local_158 [4];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined1 local_a0 [8];
  MD5_CTX ctx;
  va_list ap;
  char *p;
  uchar hash [16];
  char *buf_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_158[1] = in_RSI;
  local_158[2] = in_RDX;
  local_158[3] = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  MD5Init((MD5_CTX *)local_a0);
  ap[0]._0_8_ = &stack0x00000008;
  ctx.in[0x3c] = '0';
  ctx.in[0x3d] = '\0';
  ctx.in[0x3e] = '\0';
  ctx.in[0x3f] = '\0';
  ctx.in[0x38] = '\b';
  ctx.in[0x39] = '\0';
  ctx.in[0x3a] = '\0';
  ctx.in[0x3b] = '\0';
  while( true ) {
    if ((uint)ctx.in._56_4_ < 0x29) {
      local_170 = (undefined8 *)((long)local_158 + (long)(int)ctx.in._56_4_);
      ctx.in._56_4_ = ctx.in._56_4_ + 8;
    }
    else {
      local_170 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    buf_00 = (uchar *)*local_170;
    if (buf_00 == (uchar *)0x0) break;
    sVar1 = strlen((char *)buf_00);
    MD5Update((MD5_CTX *)local_a0,buf_00,(uint)sVar1);
  }
  MD5Final((uchar *)&p,(MD5_CTX *)local_a0);
  bin2str(buf,(uchar *)&p,0x10);
  return buf;
}

Assistant:

char *mg_md5(char buf[33], ...) {
  unsigned char hash[16];
  const char *p;
  va_list ap;
  MD5_CTX ctx;

  MD5Init(&ctx);

  va_start(ap, buf);
  while ((p = va_arg(ap, const char *)) != NULL) {
    MD5Update(&ctx, (const unsigned char *) p, (unsigned) strlen(p));
  }
  va_end(ap);

  MD5Final(hash, &ctx);
  bin2str(buf, hash, sizeof(hash));
  return buf;
}